

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::GroupNode::GroupNode
          (GroupNode *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *children)

{
  Node::Node(&this->super_Node,false);
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__GroupNode_002a16f8;
  std::
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ::vector(&this->children,children);
  return;
}

Assistant:

GroupNode (std::vector<Ref<Node>>& children)
        : children(children) {}